

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

int hexstring2data(char *arg,uchar *data,int maxdlen)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  int in_EDX;
  void *in_RSI;
  char *in_RDI;
  uchar tmp;
  int i;
  int len;
  int local_24;
  int local_4;
  
  sVar3 = strlen(in_RDI);
  iVar2 = (int)sVar3;
  if (((iVar2 == 0) || (iVar2 % 2 != 0)) ||
     (iVar2 != in_EDX * 2 && SBORROW4(iVar2,in_EDX * 2) == iVar2 + in_EDX * -2 < 0)) {
    local_4 = 1;
  }
  else {
    memset(in_RSI,0,(long)in_EDX);
    for (local_24 = 0; local_24 < iVar2 / 2; local_24 = local_24 + 1) {
      bVar1 = asc2nibble(in_RDI[local_24 << 1]);
      if (0xf < bVar1) {
        return 1;
      }
      *(byte *)((long)in_RSI + (long)local_24) = bVar1 << 4;
      bVar1 = asc2nibble(in_RDI[(long)(local_24 << 1) + 1]);
      if (0xf < bVar1) {
        return 1;
      }
      *(byte *)((long)in_RSI + (long)local_24) = *(byte *)((long)in_RSI + (long)local_24) | bVar1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int hexstring2data(char *arg, unsigned char *data, int maxdlen)
{
	int len = strlen(arg);
	int i;
	unsigned char tmp;

	if (!len || len % 2 || len > maxdlen * 2)
		return 1;

	memset(data, 0, maxdlen);

	for (i = 0; i < len / 2; i++) {
		tmp = asc2nibble(*(arg + (2 * i)));
		if (tmp > 0x0F)
			return 1;

		data[i] = (tmp << 4);

		tmp = asc2nibble(*(arg + (2 * i) + 1));
		if (tmp > 0x0F)
			return 1;

		data[i] |= tmp;
	}

	return 0;
}